

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataListTest_Test::TestBody
          (OpenDDLParserTest_parseDataListTest_Test *this)

{
  undefined1 *puVar1;
  internal iVar2;
  undefined1 *puVar3;
  Reference *pRVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  _List_node_base *p_Var9;
  Value *pVVar10;
  Value *pVVar11;
  string *psVar12;
  long lVar13;
  Reference **ppRVar14;
  long *plVar15;
  AssertHelperData *pAVar16;
  AssertionResult gtest_ar__3;
  Value *data;
  char token2 [23];
  string expStrings [2];
  list<int,_std::allocator<int>_> expValues;
  Reference *refs;
  int res;
  size_t numValues;
  char token1 [10];
  size_t numRefs;
  AssertHelper local_f8;
  AssertHelper local_f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  Value *local_e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_d0;
  undefined7 uStack_c8;
  AssertHelper local_c0;
  string local_b8;
  long *local_98 [2];
  long local_88 [2];
  undefined1 *local_78;
  undefined1 *local_70;
  long local_68;
  Reference *local_60;
  int local_54;
  size_t local_50;
  undefined8 local_48;
  undefined2 local_40;
  size_t local_38;
  
  local_e0 = (Value *)0x0;
  local_48 = 0x342c332c322c317b;
  local_40 = 0x7d;
  sVar7 = strlen((char *)&local_48);
  ppRVar14 = &local_60;
  local_60 = (Reference *)0x0;
  local_38 = 0;
  local_50 = 0;
  pcVar8 = OpenDDLParser::parseDataList
                     ((char *)&local_48,(char *)((long)&local_48 + sVar7),ddl_none,&local_e0,
                      &local_50,ppRVar14,&local_38);
  iVar2 = (internal)(pcVar8 != (char *)0x0);
  local_70 = (undefined1 *)0x0;
  local_78._0_1_ = iVar2;
  if (pcVar8 == (char *)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&local_78,(AssertionResult *)"nullptr == in","true","false",
               (char *)ppRVar14);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x26f,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (((local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78 = (undefined1 *)CONCAT71(local_78._1_7_,local_e0 != (Value *)0x0);
    local_70 = (undefined1 *)0x0;
    if (local_e0 == (Value *)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,(internal *)&local_78,(AssertionResult *)"nullptr == data","true","false"
                 ,(char *)ppRVar14);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x270,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (((local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_78 = (undefined1 *)&local_78;
      local_68 = 0;
      local_70 = local_78;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var9[1]._M_next = 1;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      local_68 = local_68 + 1;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var9[1]._M_next = 2;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      local_68 = local_68 + 1;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var9[1]._M_next = 3;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      local_68 = local_68 + 1;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var9[1]._M_next = 4;
      plVar15 = (long *)&local_78;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      pVVar11 = local_e0;
      local_68 = local_68 + 1;
      local_f0.data_._0_4_ = 4;
      if (local_e0 == (Value *)0x0) {
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        pVVar10 = Value::getNext(local_e0);
        local_d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        while (pVVar10 != (Value *)0x0) {
          pVVar11 = Value::getNext(pVVar11);
          pVVar10 = Value::getNext(pVVar11);
          local_d8.ptr_ = local_d8.ptr_ + 1;
        }
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&local_b8,"4U","countItems(data)",(uint *)&local_f0,
                 (unsigned_long *)&local_d8);
      if ((char)local_b8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_d8);
        if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)local_b8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x278,pcVar8);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (((local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((local_e0 == (Value *)0x0) || (pVVar11 = local_e0, local_e0->m_type != ddl_int32)) {
LAB_00148796:
        local_d8.ptr_ = local_d8.ptr_ & 0xffffffffffffff00;
        sStack_d0.ptr_._0_7_ = 0;
        sStack_d0.ptr_._7_1_ = 0;
        testing::Message::Message((Message *)&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b8,(internal *)&local_d8,
                   (AssertionResult *)"testValues(Value::ValueType::ddl_int32, data, expValues)",
                   "false","true",(char *)ppRVar14);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x279,local_b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (((local_f0.data_ != (AssertHelperData *)0x0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           (local_f0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_f0.data_ + 8))();
        }
      }
      else {
        do {
          plVar15 = (long *)*plVar15;
          iVar6 = bcmp(pVVar11->m_data,plVar15 + 2,pVVar11->m_size);
          if (iVar6 != 0) goto LAB_00148796;
          pVVar11 = Value::getNext(pVVar11);
        } while (pVVar11 != (Value *)0x0);
        local_d8.ptr_._0_1_ = 1;
        sStack_d0.ptr_._0_7_ = 0;
        sStack_d0.ptr_._7_1_ = 0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,local_e0);
      pRVar4 = local_60;
      if (local_60 != (Reference *)0x0) {
        Reference::~Reference(local_60);
      }
      operator_delete(pRVar4,0x10);
      local_d8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x6e6972747322207b;
      sStack_d0.ptr_._0_7_ = 0x7473222c223167;
      sStack_d0.ptr_._7_1_ = 0x72;
      uStack_c8 = 0x7d2232676e69;
      sVar7 = strlen((char *)&local_d8);
      ppRVar14 = &local_60;
      OpenDDLParser::parseDataList
                ((char *)&local_d8,(char *)((long)&local_d8.ptr_ + sVar7),ddl_none,&local_e0,
                 &local_50,ppRVar14,&local_38);
      local_f0.data_._0_1_ = (internal)(local_e0 != (Value *)0x0);
      local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e0 == (Value *)0x0) {
        testing::Message::Message((Message *)&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b8,(internal *)&local_f0,(AssertionResult *)"nullptr == data","true",
                   "false",(char *)ppRVar14);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x280,local_b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (((CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) != 0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           ((long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pVVar11 = local_e0;
        local_f8.data_._0_4_ = 2;
        if (local_e0 == (Value *)0x0) {
          pAVar16 = (AssertHelperData *)0x0;
        }
        else {
          pVVar10 = Value::getNext(local_e0);
          pAVar16 = (AssertHelperData *)0x1;
          while (pVVar10 != (Value *)0x0) {
            pVVar11 = Value::getNext(pVVar11);
            pVVar10 = Value::getNext(pVVar11);
            pAVar16 = (AssertHelperData *)((long)&pAVar16->type + 1);
          }
        }
        local_f0.data_ = pAVar16;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&local_b8,"2U","countItems(data)",(uint *)&local_f8,
                   (unsigned_long *)&local_f0);
        if ((char)local_b8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_f0);
          if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)local_b8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                     ,0x283,pcVar8);
          testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
          testing::internal::AssertHelper::~AssertHelper(&local_f8);
          if (((local_f0.data_ != (AssertHelperData *)0x0) &&
              (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
             (local_f0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_f0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar12 = &local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)psVar12,"string1","");
        plVar15 = local_88;
        local_98[0] = plVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"string2","");
        if (local_e0 != (Value *)0x0) {
          do {
            local_54 = strncmp((psVar12->_M_dataplus)._M_p,(char *)local_e0->m_data,local_e0->m_size
                              );
            local_f8.data_._0_4_ = 0;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_f0,"0","res",(int *)&local_f8,&local_54);
            if (local_f0.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_f8);
              pcVar8 = "";
              if (local_e8.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar8 = ((local_e8.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                         ,0x28b,pcVar8);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_f8);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if (((CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) != 0) &&
                  (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                 ((long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_e0 = local_e0->m_next;
            psVar12 = psVar12 + 1;
          } while (local_e0 != (Value *)0x0);
        }
        pRVar4 = local_60;
        if (local_60 != (Reference *)0x0) {
          Reference::~Reference(local_60);
        }
        operator_delete(pRVar4,0x10);
        lVar13 = -0x40;
        do {
          if (plVar15 != (long *)plVar15[-2]) {
            operator_delete((long *)plVar15[-2],*plVar15 + 1);
          }
          plVar15 = plVar15 + -4;
          lVar13 = lVar13 + 0x20;
        } while (lVar13 != 0);
      }
      puVar3 = local_78;
      while ((undefined1 **)puVar3 != &local_78) {
        puVar1 = *(undefined1 **)puVar3;
        operator_delete(puVar3,0x18);
        puVar3 = puVar1;
      }
    }
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataListTest) {
    Value *data(nullptr);
    size_t len(0);

    char *in(nullptr), *end(nullptr);
    char token1[] = "{1,2,3,4}";
    end = findEnd(token1, len);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    in = OpenDDLParser::parseDataList(token1, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with integers
    std::list<int> expValues;
    expValues.push_back(1);
    expValues.push_back(2);
    expValues.push_back(3);
    expValues.push_back(4);
    EXPECT_EQ(4U, countItems(data));
    EXPECT_TRUE(testValues(Value::ValueType::ddl_int32, data, expValues));
    registerValueForDeletion(data);
    delete refs;

    char token2[] = "{ \"string1\",\"string2\"}";
    end = findEnd(token2, len);
    in = OpenDDLParser::parseDataList(token2, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with strings
    EXPECT_EQ(2U, countItems(data));
    std::string expStrings[2] = {
        "string1",
        "string2"
    };
    size_t i(0);
    while (nullptr != data) {
        const int res(strncmp(expStrings[i].c_str(), (char *)data->m_data, data->m_size));
        EXPECT_EQ(0, res);
        data = data->m_next;
        i++;
    }
    registerValueForDeletion(data);
    delete refs;
}